

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasmFPU_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::dasmFMovem<(moira::Instr)193,(moira::Mode)7,0>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  u32 uVar1;
  int iVar2;
  Syntax SVar3;
  bool bVar4;
  uint uVar5;
  long lVar6;
  char *pcVar7;
  char cVar8;
  uint uVar9;
  ulong uVar10;
  byte bVar11;
  Dn dn;
  Dn dn_00;
  FRegList FVar12;
  Moira *this_00;
  uint ext;
  Fctrl fctrl;
  char **ppcVar13;
  Ea<(moira::Mode)7,_4> result;
  u32 local_44;
  ushort local_40;
  uint local_3c;
  
  uVar1 = *addr;
  *addr = uVar1 + 2;
  this_00 = this;
  uVar5 = (*this->_vptr_Moira[6])();
  ext = uVar5 & 0xffff;
  if (((str->style->syntax & ~MOIRA_MIT) == GNU) &&
     (bVar4 = isValidExtFPU(this_00,FMOVEM,AW,op,ext), !bVar4)) {
    *addr = uVar1;
    dasmIllegal<(moira::Instr)193,(moira::Mode)7,0>(this,str,addr,op);
    return;
  }
  if (3 < (ext >> 0xd) - 4) {
    return;
  }
  local_40 = op & 7;
  uVar9 = ext >> 0xb & 3;
  bVar11 = (byte)ext >> 4 & 7;
  fctrl.raw = ext >> 10 & 7;
  switch(ext >> 0xd) {
  case 4:
    if (((uVar5 & 0x1c00) == 0) && ((str->style->syntax & ~MOIRA_MIT) == GNU)) {
      cVar8 = 'f';
      lVar6 = 1;
      do {
        pcVar7 = str->ptr;
        str->ptr = pcVar7 + 1;
        *pcVar7 = cVar8;
        cVar8 = "fmovel"[lVar6];
        lVar6 = lVar6 + 1;
      } while (lVar6 != 7);
      if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
        pcVar7 = str->ptr;
        str->ptr = pcVar7 + 1;
        *pcVar7 = ' ';
      }
      else {
        iVar2 = (str->tab).raw;
        do {
          pcVar7 = str->ptr;
          str->ptr = pcVar7 + 1;
          *pcVar7 = ' ';
        } while (str->ptr < str->base + iVar2);
      }
      local_44 = *addr;
      *addr = local_44 + 2;
      local_3c = (*this->_vptr_Moira[6])();
      local_3c = local_3c & 0xffff;
      StrWriter::operator<<(str,(Ea<(moira::Mode)7,_4> *)&local_44);
      pcVar7 = str->ptr;
      str->ptr = pcVar7 + 1;
      *pcVar7 = ',';
      SVar3 = str->style->syntax;
      if (MUSASHI < SVar3) {
        return;
      }
      if ((0x13U >> (SVar3 & 0x1f) & 1) == 0) {
        return;
      }
      pcVar7 = str->ptr;
      str->ptr = pcVar7 + 1;
      *pcVar7 = ' ';
      return;
    }
    if (((uint)fctrl.raw < 5) && (fctrl.raw != 3)) {
      cVar8 = 'f';
      lVar6 = 1;
      do {
        pcVar7 = str->ptr;
        str->ptr = pcVar7 + 1;
        *pcVar7 = cVar8;
        cVar8 = "fmove"[lVar6];
        lVar6 = lVar6 + 1;
      } while (lVar6 != 6);
      StrWriter::operator<<(str,(Ffmt)0x0);
      if ((str->style->syntax & ~MOIRA_MIT) != GNU) {
        iVar2 = (str->tab).raw;
        do {
          pcVar7 = str->ptr;
          str->ptr = pcVar7 + 1;
          *pcVar7 = ' ';
        } while (str->ptr < str->base + iVar2);
        goto LAB_002ca325;
      }
    }
    else {
      cVar8 = 'f';
      lVar6 = 1;
      do {
        pcVar7 = str->ptr;
        str->ptr = pcVar7 + 1;
        *pcVar7 = cVar8;
        cVar8 = "fmovem"[lVar6];
        lVar6 = lVar6 + 1;
      } while (lVar6 != 7);
      StrWriter::operator<<(str,(Ffmt)0x0);
      if ((str->style->syntax & ~MOIRA_MIT) != GNU) {
        iVar2 = (str->tab).raw;
        do {
          pcVar7 = str->ptr;
          str->ptr = pcVar7 + 1;
          *pcVar7 = ' ';
        } while (str->ptr < str->base + iVar2);
        goto LAB_002ca325;
      }
    }
    pcVar7 = str->ptr;
    str->ptr = pcVar7 + 1;
    *pcVar7 = ' ';
LAB_002ca325:
    local_44 = *addr;
    *addr = local_44 + 2;
    local_3c = (*this->_vptr_Moira[6])();
    local_3c = local_3c & 0xffff;
    StrWriter::operator<<(str,(Ea<(moira::Mode)7,_4> *)&local_44);
    pcVar7 = str->ptr;
    str->ptr = pcVar7 + 1;
    *pcVar7 = ',';
    SVar3 = str->style->syntax;
    if ((SVar3 < (MUSASHI|MOIRA_MIT)) && ((0x13U >> (SVar3 & 0x1f) & 1) != 0)) {
      pcVar7 = str->ptr;
      str->ptr = pcVar7 + 1;
      *pcVar7 = ' ';
    }
    StrWriter::operator<<(str,fctrl);
    return;
  case 5:
    if (((uVar5 & 0x1c00) != 0) || ((str->style->syntax & ~MOIRA_MIT) != GNU)) {
      if (((uint)fctrl.raw < 5) && (fctrl.raw != 3)) {
        cVar8 = 'f';
        lVar6 = 1;
        do {
          pcVar7 = str->ptr;
          str->ptr = pcVar7 + 1;
          *pcVar7 = cVar8;
          cVar8 = "fmove"[lVar6];
          lVar6 = lVar6 + 1;
        } while (lVar6 != 6);
        StrWriter::operator<<(str,(Ffmt)0x0);
        if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
LAB_002ca2ec:
          pcVar7 = str->ptr;
          str->ptr = pcVar7 + 1;
          *pcVar7 = ' ';
        }
        else {
          iVar2 = (str->tab).raw;
          do {
            pcVar7 = str->ptr;
            str->ptr = pcVar7 + 1;
            *pcVar7 = ' ';
          } while (str->ptr < str->base + iVar2);
        }
      }
      else {
        cVar8 = 'f';
        lVar6 = 1;
        do {
          pcVar7 = str->ptr;
          str->ptr = pcVar7 + 1;
          *pcVar7 = cVar8;
          cVar8 = "fmovem"[lVar6];
          lVar6 = lVar6 + 1;
        } while (lVar6 != 7);
        StrWriter::operator<<(str,(Ffmt)0x0);
        if ((str->style->syntax & ~MOIRA_MIT) == GNU) goto LAB_002ca2ec;
        iVar2 = (str->tab).raw;
        do {
          pcVar7 = str->ptr;
          str->ptr = pcVar7 + 1;
          *pcVar7 = ' ';
        } while (str->ptr < str->base + iVar2);
      }
      StrWriter::operator<<(str,fctrl);
      goto LAB_002caa4a;
    }
    cVar8 = 'f';
    lVar6 = 1;
    do {
      pcVar7 = str->ptr;
      str->ptr = pcVar7 + 1;
      *pcVar7 = cVar8;
      cVar8 = "fmove"[lVar6];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 6);
    StrWriter::operator<<(str,(Ffmt)0x0);
    if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
      pcVar7 = str->ptr;
      str->ptr = pcVar7 + 1;
      *pcVar7 = ' ';
    }
    else {
      iVar2 = (str->tab).raw;
      do {
        pcVar7 = str->ptr;
        str->ptr = pcVar7 + 1;
        *pcVar7 = ' ';
      } while (str->ptr < str->base + iVar2);
    }
    pcVar7 = str->ptr;
    str->ptr = pcVar7 + 1;
    *pcVar7 = ',';
    SVar3 = str->style->syntax;
    if ((SVar3 < (MUSASHI|MOIRA_MIT)) && ((0x13U >> (SVar3 & 0x1f) & 1) != 0)) {
      pcVar7 = str->ptr;
      str->ptr = pcVar7 + 1;
      goto LAB_002cab8a;
    }
    goto LAB_002cab8d;
  case 6:
    switch(uVar9) {
    case 0:
      ppcVar13 = &str->ptr;
      cVar8 = 'f';
      lVar6 = 1;
      do {
        pcVar7 = *ppcVar13;
        *ppcVar13 = pcVar7 + 1;
        *pcVar7 = cVar8;
        cVar8 = "fmovem"[lVar6];
        lVar6 = lVar6 + 1;
      } while (lVar6 != 7);
      StrWriter::operator<<(str,(Ffmt)0x2);
      if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
        pcVar7 = str->ptr;
        str->ptr = pcVar7 + 1;
        *pcVar7 = ' ';
      }
      else {
        iVar2 = (str->tab).raw;
        do {
          pcVar7 = str->ptr;
          str->ptr = pcVar7 + 1;
          *pcVar7 = ' ';
        } while (str->ptr < str->base + iVar2);
      }
      local_44 = *addr;
      *addr = local_44 + 2;
      local_3c = (*this->_vptr_Moira[6])();
      local_3c = local_3c & 0xffff;
      StrWriter::operator<<(str,(Ea<(moira::Mode)7,_4> *)&local_44);
      pcVar7 = str->ptr;
      str->ptr = pcVar7 + 1;
      *pcVar7 = ',';
      SVar3 = str->style->syntax;
      if ((SVar3 < (MUSASHI|MOIRA_MIT)) && ((0x13U >> (SVar3 & 0x1f) & 1) != 0)) {
        pcVar7 = *ppcVar13;
        *ppcVar13 = pcVar7 + 1;
        *pcVar7 = ' ';
      }
      FVar12.raw = (u16)(uVar5 & 0xff);
      if ((uVar5 & 0xff) == 0) {
LAB_002ca8d5:
        ppcVar13 = &str->ptr;
        pcVar7 = *ppcVar13;
        *ppcVar13 = pcVar7 + 1;
        *pcVar7 = '#';
        sprintd(ppcVar13,0);
        return;
      }
      goto LAB_002ca8cb;
    case 1:
      cVar8 = 'f';
      lVar6 = 1;
      do {
        pcVar7 = str->ptr;
        str->ptr = pcVar7 + 1;
        *pcVar7 = cVar8;
        cVar8 = "fmovem"[lVar6];
        lVar6 = lVar6 + 1;
      } while (lVar6 != 7);
      StrWriter::operator<<(str,(Ffmt)0x2);
      if ((str->style->syntax & ~MOIRA_MIT) != GNU) {
        iVar2 = (str->tab).raw;
        do {
          pcVar7 = str->ptr;
          str->ptr = pcVar7 + 1;
          *pcVar7 = ' ';
        } while (str->ptr < str->base + iVar2);
        goto LAB_002ca918;
      }
      break;
    case 2:
      ppcVar13 = &str->ptr;
      cVar8 = 'f';
      lVar6 = 1;
      do {
        pcVar7 = *ppcVar13;
        *ppcVar13 = pcVar7 + 1;
        *pcVar7 = cVar8;
        cVar8 = "fmovem"[lVar6];
        lVar6 = lVar6 + 1;
      } while (lVar6 != 7);
      StrWriter::operator<<(str,(Ffmt)0x2);
      if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
        pcVar7 = str->ptr;
        str->ptr = pcVar7 + 1;
        *pcVar7 = ' ';
      }
      else {
        iVar2 = (str->tab).raw;
        do {
          pcVar7 = str->ptr;
          str->ptr = pcVar7 + 1;
          *pcVar7 = ' ';
        } while (str->ptr < str->base + iVar2);
      }
      local_44 = *addr;
      *addr = local_44 + 2;
      local_3c = (*this->_vptr_Moira[6])();
      local_3c = local_3c & 0xffff;
      StrWriter::operator<<(str,(Ea<(moira::Mode)7,_4> *)&local_44);
      pcVar7 = str->ptr;
      str->ptr = pcVar7 + 1;
      *pcVar7 = ',';
      SVar3 = str->style->syntax;
      if ((SVar3 < (MUSASHI|MOIRA_MIT)) && ((0x13U >> (SVar3 & 0x1f) & 1) != 0)) {
        pcVar7 = *ppcVar13;
        *ppcVar13 = pcVar7 + 1;
        *pcVar7 = ' ';
      }
      if ((uVar5 & 0xff) == 0) goto LAB_002ca8d5;
      uVar10 = (ulong)(uVar5 & 0xff) * 0x202020202 & 0x10884422010;
      FVar12.raw = (short)(uVar10 / 0x3ff) + (short)uVar10 & 0xff;
LAB_002ca8cb:
      StrWriter::operator<<(str,FVar12);
      return;
    case 3:
      cVar8 = 'f';
      lVar6 = 1;
      do {
        pcVar7 = str->ptr;
        str->ptr = pcVar7 + 1;
        *pcVar7 = cVar8;
        cVar8 = "fmovem"[lVar6];
        lVar6 = lVar6 + 1;
      } while (lVar6 != 7);
      StrWriter::operator<<(str,(Ffmt)0x2);
      if ((str->style->syntax & ~MOIRA_MIT) != GNU) {
        iVar2 = (str->tab).raw;
        do {
          pcVar7 = str->ptr;
          str->ptr = pcVar7 + 1;
          *pcVar7 = ' ';
        } while (str->ptr < str->base + iVar2);
        goto LAB_002ca918;
      }
    }
    pcVar7 = str->ptr;
    str->ptr = pcVar7 + 1;
    *pcVar7 = ' ';
LAB_002ca918:
    local_44 = *addr;
    *addr = local_44 + 2;
    local_3c = (*this->_vptr_Moira[6])();
    local_3c = local_3c & 0xffff;
    StrWriter::operator<<(str,(Ea<(moira::Mode)7,_4> *)&local_44);
    pcVar7 = str->ptr;
    str->ptr = pcVar7 + 1;
    *pcVar7 = ',';
    SVar3 = str->style->syntax;
    if ((SVar3 < (MUSASHI|MOIRA_MIT)) && ((0x13U >> (SVar3 & 0x1f) & 1) != 0)) {
      pcVar7 = str->ptr;
      str->ptr = pcVar7 + 1;
      *pcVar7 = ' ';
    }
    dn.raw._1_3_ = 0;
    dn.raw._0_1_ = bVar11;
    StrWriter::operator<<(str,dn);
    return;
  }
  switch(uVar9) {
  case 0:
    cVar8 = 'f';
    lVar6 = 1;
    do {
      pcVar7 = str->ptr;
      str->ptr = pcVar7 + 1;
      *pcVar7 = cVar8;
      cVar8 = "fmovem"[lVar6];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 7);
    StrWriter::operator<<(str,(Ffmt)0x2);
    if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
      pcVar7 = str->ptr;
      str->ptr = pcVar7 + 1;
      *pcVar7 = ' ';
    }
    else {
      iVar2 = (str->tab).raw;
      do {
        pcVar7 = str->ptr;
        str->ptr = pcVar7 + 1;
        *pcVar7 = ' ';
      } while (str->ptr < str->base + iVar2);
    }
    FVar12.raw = (u16)(uVar5 & 0xff);
    if ((uVar5 & 0xff) != 0) goto LAB_002ca9bc;
LAB_002ca9c3:
    ppcVar13 = &str->ptr;
    pcVar7 = *ppcVar13;
    *ppcVar13 = pcVar7 + 1;
    *pcVar7 = '#';
    sprintd(ppcVar13,0);
    break;
  case 1:
    cVar8 = 'f';
    lVar6 = 1;
    do {
      pcVar7 = str->ptr;
      str->ptr = pcVar7 + 1;
      *pcVar7 = cVar8;
      cVar8 = "fmovem"[lVar6];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 7);
    StrWriter::operator<<(str,(Ffmt)0x2);
    if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
LAB_002ca60f:
      pcVar7 = str->ptr;
      str->ptr = pcVar7 + 1;
      *pcVar7 = ' ';
    }
    else {
      iVar2 = (str->tab).raw;
      do {
        pcVar7 = str->ptr;
        str->ptr = pcVar7 + 1;
        *pcVar7 = ' ';
      } while (str->ptr < str->base + iVar2);
    }
    goto LAB_002caa3e;
  case 2:
    cVar8 = 'f';
    lVar6 = 1;
    do {
      pcVar7 = str->ptr;
      str->ptr = pcVar7 + 1;
      *pcVar7 = cVar8;
      cVar8 = "fmovem"[lVar6];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 7);
    StrWriter::operator<<(str,(Ffmt)0x2);
    if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
      pcVar7 = str->ptr;
      str->ptr = pcVar7 + 1;
      *pcVar7 = ' ';
    }
    else {
      iVar2 = (str->tab).raw;
      do {
        pcVar7 = str->ptr;
        str->ptr = pcVar7 + 1;
        *pcVar7 = ' ';
      } while (str->ptr < str->base + iVar2);
    }
    if ((uVar5 & 0xff) == 0) goto LAB_002ca9c3;
    uVar10 = (ulong)(uVar5 & 0xff) * 0x202020202 & 0x10884422010;
    FVar12.raw = (short)(uVar10 / 0x3ff) + (short)uVar10 & 0xff;
LAB_002ca9bc:
    StrWriter::operator<<(str,FVar12);
    break;
  case 3:
    cVar8 = 'f';
    lVar6 = 1;
    do {
      pcVar7 = str->ptr;
      str->ptr = pcVar7 + 1;
      *pcVar7 = cVar8;
      cVar8 = "fmovem"[lVar6];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 7);
    StrWriter::operator<<(str,(Ffmt)0x2);
    if ((str->style->syntax & ~MOIRA_MIT) == GNU) goto LAB_002ca60f;
    iVar2 = (str->tab).raw;
    do {
      pcVar7 = str->ptr;
      str->ptr = pcVar7 + 1;
      *pcVar7 = ' ';
    } while (str->ptr < str->base + iVar2);
LAB_002caa3e:
    dn_00.raw._1_3_ = 0;
    dn_00.raw._0_1_ = bVar11;
    StrWriter::operator<<(str,dn_00);
LAB_002caa4a:
    pcVar7 = str->ptr;
    str->ptr = pcVar7 + 1;
    *pcVar7 = ',';
    SVar3 = str->style->syntax;
    if ((SVar3 < (MUSASHI|MOIRA_MIT)) && ((0x13U >> (SVar3 & 0x1f) & 1) != 0)) {
      pcVar7 = str->ptr;
      str->ptr = pcVar7 + 1;
      *pcVar7 = ' ';
    }
    local_44 = *addr;
    *addr = local_44 + 2;
    goto LAB_002caba5;
  }
  ppcVar13 = &str->ptr;
  pcVar7 = *ppcVar13;
  str->ptr = pcVar7 + 1;
  *pcVar7 = ',';
  SVar3 = str->style->syntax;
  if ((SVar3 < (MUSASHI|MOIRA_MIT)) && ((0x13U >> (SVar3 & 0x1f) & 1) != 0)) {
    pcVar7 = *ppcVar13;
    *ppcVar13 = pcVar7 + 1;
LAB_002cab8a:
    *pcVar7 = ' ';
  }
LAB_002cab8d:
  local_44 = *addr;
  *addr = local_44 + 2;
LAB_002caba5:
  local_3c = (*this->_vptr_Moira[6])();
  local_3c = local_3c & 0xffff;
  StrWriter::operator<<(str,(Ea<(moira::Mode)7,_4> *)&local_44);
  return;
}

Assistant:

void
Moira::dasmFMovem(StrWriter &str, u32 &addr, u16 op) const
{
    auto old = addr;
    auto ext = dasmIncRead(addr);
    auto reg = _____________xxx (op);
    auto cod = xxx_____________ (ext);
    auto mod = ___xx___________ (ext);
    auto rrr = _________xxx____ (ext);
    auto lll = ___xxx__________ (ext);

    // Catch illegal extension words
    if (str.style.syntax == Syntax::GNU || str.style.syntax == Syntax::GNU_MIT) {

        if (!isValidExtFPU(I, M, op, ext)) {

            addr = old;
            dasmIllegal<I, M, S>(str, addr, op);
            return;
        }
    }

    switch (cod) {

        case 0b100: // Ea to Cntrl

            if ((ext & 0x1C00) == 0) {

                if (str.style.syntax == Syntax::GNU || str.style.syntax == Syntax::GNU_MIT) {

                    str << "fmovel" << str.tab << Op<M, Long>(reg, addr) << Sep{};
                    return;
                }
            }
            if (lll == 0 || lll == 1 || lll == 2 || lll == 4) {
                str << Ins<Instr::FMOVE>{} << Ffmt{0} << str.tab;
            } else {
                str << Ins<Instr::FMOVEM>{} << Ffmt{0} << str.tab;
            }
            str << Op<M, Long>(reg, addr) << Sep{} << Fctrl{lll};
            break;

        case 0b101: // Cntrl to Ea

            if ((ext & 0x1C00) == 0) {

                if (str.style.syntax == Syntax::GNU || str.style.syntax == Syntax::GNU_MIT) {

                    str << Ins<Instr::FMOVE>{} << Ffmt{0} << str.tab << Sep{} << Op<M, Long>(reg, addr);
                    return;
                }
            }
            if (lll == 0 || lll == 1 || lll == 2 || lll == 4) {
                str << Ins<Instr::FMOVE>{} << Ffmt{0} << str.tab;
            } else {
                str << Ins<Instr::FMOVEM>{} << Ffmt{0} << str.tab;
            }
            str << Fctrl{lll} << Sep{} << Op<M, Long>(reg, addr);
            break;

        case 0b110: // Memory to FPU

            switch (mod) {

                case 0b00: // Static list, predecrement addressing

                    str << Ins<I>{} << Ffmt{2} << str.tab;
                    str << Op<M, Long>(reg, addr) << Sep{};
                    if (ext & 0xFF) {
                        str << FRegList(ext & 0xFF);
                    } else {
                        str << Imd{0};
                    }
                    break;

                case 0b01: // Dynamic list, predecrement addressing

                    str << Ins<I>{} << Ffmt{2} << str.tab;
                    str << Op<M, Long>(reg, addr) << Sep{};
                    str << Dn{rrr};
                    break;

                case 0b10: // Static list, postincrement addressing

                    str << Ins<I>{} << Ffmt{2} << str.tab;
                    str << Op<M, Long>(reg, addr) << Sep{};
                    if (ext & 0xFF) {
                        str << FRegList(REVERSE_8(ext & 0xFF));
                    } else {
                        str << Imd{0};
                    }
                    break;

                case 0b11: // Dynamic list, postincrement addressing

                    str << Ins<I>{} << Ffmt{2} << str.tab;
                    str << Op<M, Long>(reg, addr) << Sep{};
                    str << Dn{rrr};
                    break;
            }
            break;

        case 0b111: // FPU to memory

            switch (mod) {

                case 0b00: // Static list, predecrement addressing

                    str << Ins<I>{} << Ffmt{2} << str.tab;
                    if (ext & 0xFF) {
                        str << FRegList(ext & 0xFF);
                    } else {
                        str << Imd{0};
                    }
                    str << Sep{} << Op<M, Long>(reg, addr);
                    break;

                case 0b01: // Dynamic list, predecrement addressing

                    str << Ins<I>{} << Ffmt{2} << str.tab;
                    str << Dn{rrr} << Sep{};
                    str << Op<M, Long>(reg, addr);
                    break;

                case 0b10: // Static list, postincrement addressing

                    str << Ins<I>{} << Ffmt{2} << str.tab;
                    if (ext & 0xFF) {
                        str << FRegList(REVERSE_8(ext & 0xFF)) ;
                    } else {
                        str << Imd{0};
                    }
                    str << Sep{} << Op<M, Long>(reg, addr);
                    break;

                case 0b11: // Dynamic list, postincrement addressing

                    str << Ins<I>{} << Ffmt{2} << str.tab;
                    str << Dn{rrr} << Sep{};
                    str << Op<M, Long>(reg, addr);
                    break;
            }
            break;
    }
}